

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegd_parser.c
# Opt level: O1

MPP_RET jpegd_callback(void *decoder,void *err_info)

{
  int iVar1;
  RK_S32 index;
  ulong uVar2;
  RK_U32 v;
  MppFrame frame;
  MppFrame local_18;
  
  uVar2 = *(ulong *)(*err_info + 8);
  iVar1 = *(int *)((long)err_info + 0x10);
  index = *(RK_S32 *)(*err_info + 0x34);
  local_18 = (MppFrame)0x0;
  if (-1 < index) {
    mpp_buf_slot_get_prop(*(MppBufSlots *)((long)decoder + 8),index,SLOT_FRAME_PTR,&local_18);
  }
  if ((local_18 != (MppFrame)0x0) && ((uVar2 & 4) != 0 || iVar1 != 0)) {
    v = 0x10;
    if ((uVar2 & 4) == 0) {
      v = (uint)(iVar1 != 0) << 8;
    }
    mpp_frame_set_errinfo(local_18,v);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET jpegd_callback(void *decoder, void *err_info)
{
    JpegdCtx *JpegCtx = (JpegdCtx *)decoder;
    DecCbHalDone *ctx = (DecCbHalDone *)err_info;
    HalDecTask *task_dec = (HalDecTask *)ctx->task;
    RK_U32 task_err = task_dec->flags.parse_err;
    RK_U32 hw_dec_err = ctx->hard_err;
    RK_S32 output = task_dec->output;
    RK_U32 err_mark = 0;
    MppFrame frame = NULL;

    if (output >= 0)
        mpp_buf_slot_get_prop(JpegCtx->frame_slots, output, SLOT_FRAME_PTR, &frame);

    if (!frame)
        goto __RETURN;

    /* check and mark current frame */
    if (task_err)
        err_mark |= MPP_FRAME_ERR_DEC_INVALID;
    else if (hw_dec_err)
        err_mark |= MPP_FRAME_ERR_DEC_HW_ERR;
    if (err_mark)
        mpp_frame_set_errinfo(frame, err_mark);

__RETURN:
    return MPP_OK;
}